

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_string.c
# Opt level: O0

char * cmime_string_encode_to_7bit(char *s,CMimeStringEncodingType_T t)

{
  int iVar1;
  char *s_00;
  char *local_38;
  char *enc;
  char *ptemp;
  char *out;
  CMimeInfo_T *mi;
  char *pcStack_10;
  CMimeStringEncodingType_T t_local;
  char *s_local;
  
  out = (char *)0x0;
  ptemp = (char *)0x0;
  local_38 = (char *)0x0;
  mi._4_4_ = t;
  pcStack_10 = s;
  if (s == (char *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_string.c"
                  ,0x83,"char *cmime_string_encode_to_7bit(const char *, CMimeStringEncodingType_T)"
                 );
  }
  out = (char *)cmime_util_info_get_from_string(s);
  iVar1 = strcmp(((CMimeInfo_T *)out)->mime_encoding,"us-ascii");
  if (iVar1 == 0) {
    ptemp = strdup(pcStack_10);
  }
  else {
    if (mi._4_4_ == CMIME_STRING_ENCODING_B64) {
      enc = cmime_base64_encode_string(pcStack_10);
      local_38 = strdup("b");
    }
    else if (mi._4_4_ == CMIME_STRING_ENCODING_QP) {
      s_00 = cmime_qp_encode(pcStack_10,(char *)0x0);
      enc = cmime_string_chomp(s_00);
      local_38 = strdup("q");
    }
    else {
      enc = strdup(pcStack_10);
    }
    asprintf(&ptemp,"=?%s?%s?%s?=",*(undefined8 *)(out + 8),local_38,enc);
    free(enc);
    free(local_38);
  }
  cmime_util_info_free((CMimeInfo_T *)out);
  return ptemp;
}

Assistant:

char *cmime_string_encode_to_7bit(const char *s, CMimeStringEncodingType_T t) {
    CMimeInfo_T *mi = NULL;
    char *out = NULL;
    char *ptemp = NULL;
    char *enc = NULL;

    assert(s);

    // =?charset?encoding?text?=
    mi = cmime_util_info_get_from_string(s);

    if (strcmp(mi->mime_encoding,"us-ascii")!=0) {
        if (t == CMIME_STRING_ENCODING_B64) {
            ptemp = cmime_base64_encode_string(s); 
            enc = strdup("b");
        } else if (t == CMIME_STRING_ENCODING_QP) {
            ptemp = cmime_qp_encode((char *)s,NULL); 
            ptemp = cmime_string_chomp(ptemp);
            enc = strdup("q");
        } else {
            ptemp = strdup(s);
        }

        asprintf(&out,"=?%s?%s?%s?=",mi->mime_encoding,enc,ptemp);
        free(ptemp);
        free(enc);
    } else {
        out = strdup(s);
    }

    cmime_util_info_free(mi);
    return out;
}